

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O2

void __thiscall sensors_analytics::DefaultConsumer::DumpRecordToDisk(DefaultConsumer *this)

{
  ostream *poVar1;
  _Map_pointer ppbVar2;
  _Elt_pointer pbVar3;
  _Elt_pointer pbVar4;
  ofstream staging_ofs;
  
  std::ofstream::ofstream(&staging_ofs,(this->data_file_path_)._M_dataplus._M_p,_S_trunc|_S_out);
  pbVar4 = (this->records_).
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  pbVar3 = (this->records_).
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_last;
  ppbVar2 = (this->records_).
            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_node;
  while (pbVar4 != (this->records_).
                   super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
    poVar1 = std::operator<<((ostream *)&staging_ofs,(string *)pbVar4);
    std::endl<char,std::char_traits<char>>(poVar1);
    pbVar4 = pbVar4 + 1;
    if (pbVar4 == pbVar3) {
      pbVar4 = ppbVar2[1];
      ppbVar2 = ppbVar2 + 1;
      pbVar3 = pbVar4 + 0x10;
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&staging_ofs);
  return;
}

Assistant:

inline void DefaultConsumer::DumpRecordToDisk() {
  std::ofstream staging_ofs
      (data_file_path_.c_str(), std::ofstream::out | std::ofstream::trunc);
  for (std::deque<string>::const_iterator iterator = records_.begin();
       iterator != records_.end(); ++iterator) {
    staging_ofs << *iterator << std::endl;
  }
  staging_ofs.close();
}